

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

void __thiscall wabt::intrusive_list<wabt::Expr>::clear(intrusive_list<wabt::Expr> *this)

{
  _func_int ***ppp_Var1;
  Expr *pEVar2;
  
  pEVar2 = this->first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var1 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var1)[1])();
  }
  this->first_ = (Expr *)0x0;
  this->last_ = (Expr *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void intrusive_list<T>::clear() noexcept {
  for (T* iter = first_; iter;) {
    T* next = iter->next_;
    delete iter;
    iter = next;
  }
  first_ = last_ = nullptr;
  size_ = 0;
}